

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

Subtree ts_parser__reuse_node
                  (TSParser *self,StackVersion version,TSStateId *state,uint32_t position,
                  Subtree last_external_token,TableEntry *table_entry)

{
  TSLanguage *pTVar1;
  _Bool _Var2;
  TSSymbol TVar3;
  TSStateId TVar4;
  TSSymbol symbol;
  uint32_t start_position;
  uint32_t uVar5;
  Subtree self_00;
  char *pcVar6;
  char *pcVar7;
  char *pcStack_68;
  TSSymbol leaf_symbol;
  char *reason;
  uint32_t end_byte_offset;
  uint32_t byte_offset;
  Subtree result;
  TableEntry *table_entry_local;
  uint32_t position_local;
  TSStateId *state_local;
  StackVersion version_local;
  TSParser *self_local;
  Subtree last_external_token_local;
  
  while( true ) {
    self_00 = reusable_node_tree(&self->reusable_node);
    if (self_00.ptr == (SubtreeHeapData *)0x0) {
      return (Subtree)((Subtree)0x0).ptr;
    }
    start_position = reusable_node_byte_offset(&self->reusable_node);
    uVar5 = ts_subtree_total_bytes(self_00);
    if (position < start_position) break;
    if (start_position < position) {
      if (((self->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
         (self->dot_graph_file != (FILE *)0x0)) {
        pTVar1 = self->language;
        TVar3 = ts_subtree_symbol(self_00);
        pcVar6 = ts_language_symbol_name(pTVar1,TVar3);
        snprintf((self->lexer).debug_buffer,0x400,"past_reusable_node symbol:%s",pcVar6);
        ts_parser__log(self);
      }
      if ((start_position + uVar5 <= position) ||
         (_Var2 = reusable_node_descend(&self->reusable_node), !_Var2)) {
        reusable_node_advance(&self->reusable_node);
      }
    }
    else {
      _Var2 = ts_subtree_external_scanner_state_eq
                        ((self->reusable_node).last_external_token,last_external_token);
      if (_Var2) {
        pcStack_68 = (char *)0x0;
        _Var2 = ts_subtree_has_changes(self_00);
        if (_Var2) {
          pcStack_68 = "has_changes";
        }
        else {
          _Var2 = ts_subtree_is_error(self_00);
          if (_Var2) {
            pcStack_68 = "is_error";
          }
          else {
            _Var2 = ts_subtree_missing(self_00);
            if (_Var2) {
              pcStack_68 = "is_missing";
            }
            else {
              _Var2 = ts_subtree_is_fragile(self_00);
              if (_Var2) {
                pcStack_68 = "is_fragile";
              }
              else {
                _Var2 = ts_parser__has_included_range_difference
                                  (self,start_position,start_position + uVar5);
                if (_Var2) {
                  pcStack_68 = "contains_different_included_range";
                }
              }
            }
          }
        }
        if (pcStack_68 == (char *)0x0) {
          TVar3 = ts_subtree_leaf_symbol(self_00);
          ts_language_table_entry(self->language,*state,TVar3,table_entry);
          _Var2 = ts_parser__can_reuse_first_leaf(self,*state,self_00,table_entry);
          if (!_Var2) {
            if (((self->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
               (self->dot_graph_file != (FILE *)0x0)) {
              pTVar1 = self->language;
              symbol = ts_subtree_symbol(self_00);
              pcVar6 = ts_language_symbol_name(pTVar1,symbol);
              pcVar7 = ts_language_symbol_name(self->language,TVar3);
              snprintf((self->lexer).debug_buffer,0x400,
                       "cant_reuse_node symbol:%s, first_leaf_symbol:%s",pcVar6,pcVar7);
              ts_parser__log(self);
            }
            reusable_node_advance_past_leaf(&self->reusable_node);
            return (Subtree)(SubtreeHeapData *)0x0;
          }
          if (((self->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
             (self->dot_graph_file != (FILE *)0x0)) {
            pTVar1 = self->language;
            TVar3 = ts_subtree_symbol(self_00);
            pcVar6 = ts_language_symbol_name(pTVar1,TVar3);
            snprintf((self->lexer).debug_buffer,0x400,"reuse_node symbol:%s",pcVar6);
            ts_parser__log(self);
          }
          ts_subtree_retain(self_00);
          return (Subtree)self_00.ptr;
        }
        if (((self->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
           (self->dot_graph_file != (FILE *)0x0)) {
          pTVar1 = self->language;
          TVar3 = ts_subtree_symbol(self_00);
          pcVar6 = ts_language_symbol_name(pTVar1,TVar3);
          snprintf((self->lexer).debug_buffer,0x400,"cant_reuse_node_%s tree:%s",pcStack_68,pcVar6);
          ts_parser__log(self);
        }
        _Var2 = reusable_node_descend(&self->reusable_node);
        if (!_Var2) {
          reusable_node_advance(&self->reusable_node);
          ts_parser__breakdown_top_of_stack(self,version);
          TVar4 = ts_stack_state(self->stack,version);
          *state = TVar4;
        }
      }
      else {
        if (((self->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
           (self->dot_graph_file != (FILE *)0x0)) {
          pTVar1 = self->language;
          TVar3 = ts_subtree_symbol(self_00);
          pcVar6 = ts_language_symbol_name(pTVar1,TVar3);
          snprintf((self->lexer).debug_buffer,0x400,
                   "reusable_node_has_different_external_scanner_state symbol:%s",pcVar6);
          ts_parser__log(self);
        }
        reusable_node_advance(&self->reusable_node);
      }
    }
  }
  if (((self->lexer).logger.log == (_func_void_void_ptr_TSLogType_char_ptr *)0x0) &&
     (self->dot_graph_file == (FILE *)0x0)) {
    return (Subtree)(SubtreeHeapData *)0x0;
  }
  pTVar1 = self->language;
  TVar3 = ts_subtree_symbol(self_00);
  pcVar6 = ts_language_symbol_name(pTVar1,TVar3);
  snprintf((self->lexer).debug_buffer,0x400,"before_reusable_node symbol:%s",pcVar6);
  ts_parser__log(self);
  return (Subtree)(SubtreeHeapData *)0x0;
}

Assistant:

static Subtree ts_parser__reuse_node(TSParser *self, StackVersion version,
                                     TSStateId *state, uint32_t position,
                                     Subtree last_external_token, TableEntry *table_entry) {
  Subtree result;
  while ((result = reusable_node_tree(&self->reusable_node)).ptr) {
    uint32_t byte_offset = reusable_node_byte_offset(&self->reusable_node);
    uint32_t end_byte_offset = byte_offset + ts_subtree_total_bytes(result);

    if (byte_offset > position) {
      LOG("before_reusable_node symbol:%s", TREE_NAME(result));
      break;
    }

    if (byte_offset < position) {
      LOG("past_reusable_node symbol:%s", TREE_NAME(result));
      if (end_byte_offset <= position || !reusable_node_descend(&self->reusable_node)) {
        reusable_node_advance(&self->reusable_node);
      }
      continue;
    }

    if (!ts_subtree_external_scanner_state_eq(self->reusable_node.last_external_token, last_external_token)) {
      LOG("reusable_node_has_different_external_scanner_state symbol:%s", TREE_NAME(result));
      reusable_node_advance(&self->reusable_node);
      continue;
    }

    const char *reason = NULL;
    if (ts_subtree_has_changes(result)) {
      reason = "has_changes";
    } else if (ts_subtree_is_error(result)) {
      reason = "is_error";
    } else if (ts_subtree_missing(result)) {
      reason = "is_missing";
    } else if (ts_subtree_is_fragile(result)) {
      reason = "is_fragile";
    } else if (ts_parser__has_included_range_difference(self, byte_offset, end_byte_offset)) {
      reason = "contains_different_included_range";
    }

    if (reason) {
      LOG("cant_reuse_node_%s tree:%s", reason, TREE_NAME(result));
      if (!reusable_node_descend(&self->reusable_node)) {
        reusable_node_advance(&self->reusable_node);
        ts_parser__breakdown_top_of_stack(self, version);
        *state = ts_stack_state(self->stack, version);
      }
      continue;
    }

    TSSymbol leaf_symbol = ts_subtree_leaf_symbol(result);
    ts_language_table_entry(self->language, *state, leaf_symbol, table_entry);
    if (!ts_parser__can_reuse_first_leaf(self, *state, result, table_entry)) {
      LOG(
        "cant_reuse_node symbol:%s, first_leaf_symbol:%s",
        TREE_NAME(result),
        SYM_NAME(leaf_symbol)
      );
      reusable_node_advance_past_leaf(&self->reusable_node);
      break;
    }

    LOG("reuse_node symbol:%s", TREE_NAME(result));
    ts_subtree_retain(result);
    return result;
  }

  return NULL_SUBTREE;
}